

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O0

void __thiscall HEkkDual::initialiseInstanceParallel(HEkkDual *this,HEkk *simplex)

{
  uint *puVar1;
  HVectorBase<double> *in_RDI;
  HighsInt i_1;
  HighsInt i;
  HighsInt pass_num_slice;
  HighsInt num_concurrency;
  HEkk *in_stack_fffffffffffffe58;
  HEkkDualRow *this_00;
  undefined8 in_stack_fffffffffffffe68;
  HighsInt in_stack_fffffffffffffecc;
  HEkkDual *in_stack_fffffffffffffed0;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  uint local_18;
  uint local_14;
  
  if ((in_RDI->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish[0xa02] != 1) {
    local_14 = (in_RDI->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish[0xa4e];
    if ((in_RDI->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish[0xa02] == 2) {
      local_18 = local_14 - 2;
      if ((int)local_18 < 1) {
        highsLogDev((HighsLogOptions *)
                    (*(long *)((in_RDI->index).super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_finish + 2) + 0x380),kWarning,
                    "SIP trying to use using %d slices due to concurrency (%d) being too small: results unpredictable\n"
                    ,(ulong)local_18,(ulong)local_14);
      }
    }
    else {
      *(uint *)&in_RDI[0x1e].array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start = local_14;
      if (*(int *)&in_RDI[0x1e].array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start < 1) {
        *(undefined4 *)
         &in_RDI[0x1e].array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = 1;
      }
      if (8 < *(int *)&in_RDI[0x1e].array.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start) {
        *(undefined4 *)
         &in_RDI[0x1e].array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = 8;
      }
      for (local_1c = 0;
          local_1c <
          *(int *)&in_RDI[0x1e].array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start; local_1c = local_1c + 1) {
        *(undefined4 *)((long)in_RDI + (long)local_1c * 0x248 + 0x14d8) = 0xffffffff;
        HVectorBase<double>::setup(in_RDI,(HighsInt)((ulong)in_stack_fffffffffffffe68 >> 0x20));
        HVectorBase<double>::setup(in_RDI,(HighsInt)((ulong)in_stack_fffffffffffffe68 >> 0x20));
        HVectorBase<double>::setup(in_RDI,(HighsInt)((ulong)in_stack_fffffffffffffe68 >> 0x20));
      }
      local_20 = *(int *)&in_RDI[0x1e].array.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start + -1;
      local_24 = 1;
      puVar1 = (uint *)std::max<int>(&local_20,&local_24);
      local_18 = *puVar1;
      if ((int)local_18 < 1) {
        highsLogDev((HighsLogOptions *)
                    (*(long *)((in_RDI->index).super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_finish + 2) + 0x380),kWarning,
                    "PAMI trying to use using %d slices due to concurrency (%d) being too small: results unpredictable\n"
                    ,(ulong)local_18,(ulong)local_14);
      }
    }
    for (local_28 = 0; local_28 < (int)local_18; local_28 = local_28 + 1) {
      this_00 = (HEkkDualRow *)&in_RDI[0x1e].index;
      HEkkDualRow::HEkkDualRow(this_00,in_stack_fffffffffffffe58);
      std::vector<HEkkDualRow,_std::allocator<HEkkDualRow>_>::push_back
                ((vector<HEkkDualRow,_std::allocator<HEkkDualRow>_> *)this_00,
                 (value_type *)in_stack_fffffffffffffe58);
      HEkkDualRow::~HEkkDualRow(this_00);
    }
    initSlice(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
    *(undefined4 *)
     &in_RDI[0x1e].array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = 0;
  }
  return;
}

Assistant:

void HEkkDual::initialiseInstanceParallel(HEkk& simplex) {
  // No need to call this with kSimplexStrategyDualPlain
  if (ekk_instance_.info_.simplex_strategy == kSimplexStrategyDualPlain) return;

  // Identify the (current) number of HiGHS tasks to be used
  const HighsInt num_concurrency = ekk_instance_.info_.num_concurrency;

  HighsInt pass_num_slice;
  if (ekk_instance_.info_.simplex_strategy == kSimplexStrategyDualTasks) {
    // Initialize for tasks
    pass_num_slice = num_concurrency - 2;
    assert(pass_num_slice > 0);
    if (pass_num_slice <= 0) {
      highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kWarning,
                  "SIP trying to use using %" HIGHSINT_FORMAT
                  " slices due to concurrency (%" HIGHSINT_FORMAT
                  ") being too small: results unpredictable\n",
                  pass_num_slice, num_concurrency);
    }
  } else {
    // Initialize for multi
    multi_num = num_concurrency;
    if (multi_num < 1) multi_num = 1;
    if (multi_num > kSimplexConcurrencyLimit)
      multi_num = kSimplexConcurrencyLimit;
    for (HighsInt i = 0; i < multi_num; i++) {
      multi_choice[i].row_out = -1;
      multi_choice[i].row_ep.setup(solver_num_row);
      multi_choice[i].col_aq.setup(solver_num_row);
      multi_choice[i].col_BFRT.setup(solver_num_row);
    }
    pass_num_slice = max(multi_num - 1, HighsInt{1});
    assert(pass_num_slice > 0);
    if (pass_num_slice <= 0) {
      highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kWarning,
                  "PAMI trying to use using %" HIGHSINT_FORMAT
                  " slices due to concurrency (%" HIGHSINT_FORMAT
                  ") being too small: results unpredictable\n",
                  pass_num_slice, num_concurrency);
    }
  }
  // Create the multiple HEkkDualRow instances: one for each column
  // slice
  for (HighsInt i = 0; i < pass_num_slice; i++)
    slice_dualRow.push_back(HEkkDualRow(simplex));
  // Initialise the column slices
  initSlice(pass_num_slice);
  multi_iteration = 0;
}